

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

libcaption_stauts_t cea708_parse_h262(uint8_t *data,size_t size,cea708_t *cea708)

{
  uint8_t uVar1;
  uint uVar2;
  libcaption_stauts_t lVar3;
  
  lVar3 = LIBCAPTION_ERROR;
  if (6 < size && data != (uint8_t *)0x0) {
    uVar2 = *(uint *)data;
    cea708->user_identifier =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar1 = data[4];
    cea708->user_data_type_code = uVar1;
    lVar3 = LIBCAPTION_OK;
    if (uVar1 == '\x03') {
      cea708_parse_user_data_type_strcture(data + 5,size - 5,&cea708->user_data);
    }
  }
  return lVar3;
}

Assistant:

libcaption_stauts_t cea708_parse_h262(const uint8_t* data, size_t size, cea708_t* cea708)
{
    if (!data || 7 > size) {
        return LIBCAPTION_ERROR;
    }

    cea708->user_identifier = ((data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3]);
    cea708->user_data_type_code = data[4];
    if (3 == cea708->user_data_type_code) {
        cea708_parse_user_data_type_strcture(data + 5, size - 5, &cea708->user_data);
    }

    return LIBCAPTION_OK;
}